

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O3

bool is_binary_string(string *v,string *str)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  string *__range2;
  byte bVar6;
  long *local_48 [2];
  long local_38 [2];
  
  std::__cxx11::string::substr((ulong)local_48,(ulong)v);
  iVar3 = std::__cxx11::string::compare((char *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (iVar3 == 0) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)v);
    std::__cxx11::string::operator=((string *)str,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    uVar4 = str->_M_string_length;
    if (uVar4 == 0) {
      bVar2 = true;
    }
    else {
      uVar5 = 0;
      do {
        cVar1 = (str->_M_dataplus)._M_p[uVar5];
        if (9 < (byte)(cVar1 - 0x30U)) {
          if (cVar1 < 'a') {
            if ('@' < cVar1) {
              bVar6 = cVar1 - 0x37;
              goto LAB_0020ce3d;
            }
          }
          else {
            bVar6 = cVar1 + 0xa9;
LAB_0020ce3d:
            if (bVar6 < 0x10) goto LAB_0020ce43;
          }
          bVar6 = 0;
          uVar4 = uVar5 & 0xffffffff;
          goto LAB_0020ce57;
        }
LAB_0020ce43:
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
      bVar6 = 1;
LAB_0020ce57:
      bVar2 = (bool)((uVar4 & 1) == 0 & bVar6);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool
is_binary_string(std::string const& v, std::string& str)
{
    if (v.substr(0, 2) == "b:") {
        str = v.substr(2);
        int count = 0;
        for (char c: str) {
            if (!util::is_hex_digit(c)) {
                return false;
            }
            ++count;
        }
        return (count % 2 == 0);
    }
    return false;
}